

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

void __thiscall
wabt::TypeChecker::PrintStackIfFailed
          (TypeChecker *this,Result result,char *desc,TypeVector *expected)

{
  pointer pTVar1;
  Result RVar2;
  pointer prefix;
  char *types;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  Label *local_a8;
  Label *label;
  _anonymous_namespace_ *local_98;
  ulong local_90;
  string local_88;
  size_type *local_68;
  string message;
  TypeVector actual;
  
  if (result.enum_ != Ok) {
    sVar4 = 0;
    label = (Label *)desc;
    RVar2 = GetLabel(this,0,&local_a8);
    if (RVar2.enum_ == Ok) {
      sVar4 = local_a8->type_stack_limit;
    }
    message.field_2._8_8_ = 0;
    actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pTVar1 = (expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    prefix = (expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_90 = 4;
    if (pTVar1 != prefix) {
      local_90 = (long)pTVar1 - (long)prefix >> 2;
    }
    uVar3 = ((long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2) - sVar4;
    uVar5 = uVar3;
    if (local_90 < uVar3) {
      uVar5 = local_90;
    }
    local_98 = (_anonymous_namespace_ *)expected;
    if (uVar5 != 0) {
      do {
        RVar2 = PeekType(this,(int)uVar5 - 1,(Type *)&local_68);
        if (RVar2.enum_ != Ok) {
          __assert_fail("Succeeded(result)",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/type-checker.cc"
                        ,0x138,
                        "void wabt::TypeChecker::PrintStackIfFailed(Result, const char *, const TypeVector &)"
                       );
        }
        if (actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_realloc_insert<wabt::Type_const&>
                    ((vector<wabt::Type,std::allocator<wabt::Type>> *)
                     (message.field_2._M_local_buf + 8),(iterator)0x0,(Type *)&local_68);
        }
        else {
          *actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start = (Type)local_68;
          actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
    local_68 = &message._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"type mismatch in ","");
    std::__cxx11::string::append((string *)&local_68,(char *)label);
    std::__cxx11::string::append((string *)&local_68,", expected ");
    (anonymous_namespace)::TypesToString_abi_cxx11_
              (&local_88,local_98,(TypeVector *)0x0,(char *)prefix);
    std::__cxx11::string::_M_append
              ((string *)&local_68,local_88._M_dataplus._M_p,local_88._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    std::__cxx11::string::append((string *)&local_68," but got ");
    types = (char *)0x0;
    if (local_90 < uVar3) {
      types = "... ";
    }
    (anonymous_namespace)::TypesToString_abi_cxx11_
              (&local_88,(_anonymous_namespace_ *)(message.field_2._M_local_buf + 8),
               (TypeVector *)types,(char *)prefix);
    std::__cxx11::string::_M_append
              ((string *)&local_68,local_88._M_dataplus._M_p,local_88._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    PrintError(this,"%s",local_68);
    if (local_68 != &message._M_string_length) {
      operator_delete(local_68);
    }
    if (message.field_2._8_8_ != 0) {
      operator_delete((void *)message.field_2._8_8_);
    }
  }
  return;
}

Assistant:

void TypeChecker::PrintStackIfFailed(Result result,
                                     const char* desc,
                                     const TypeVector& expected) {
  if (Succeeded(result)) {
    return;
  }

  size_t limit = 0;
  Label* label;
  if (Succeeded(TopLabel(&label))) {
    limit = label->type_stack_limit;
  }

  TypeVector actual;
  size_t max_depth = type_stack_.size() - limit;

  // In general we want to print as many values of the actual stack as were
  // expected. However, if the stack was expected to be empty, we should
  // print some amount of the actual stack.
  size_t actual_size;
  if (expected.size() == 0) {
    // Don't print too many elements if the stack is really deep.
    const size_t kMaxActualStackToPrint = 4;
    actual_size = std::min(kMaxActualStackToPrint, max_depth);
  } else {
    actual_size = std::min(expected.size(), max_depth);
  }

  bool incomplete_actual_stack = actual_size != max_depth;

  for (size_t i = 0; i < actual_size; ++i) {
    Type type;
    Result result = PeekType(actual_size - i - 1, &type);
    WABT_USE(result);
    assert(Succeeded(result));
    actual.push_back(type);
  }

  std::string message = "type mismatch in ";
  message += desc;
  message += ", expected ";
  message += TypesToString(expected);
  message += " but got ";
  message += TypesToString(actual, incomplete_actual_stack ? "... " : nullptr);

  PrintError("%s", message.c_str());
}